

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.hpp
# Opt level: O2

void __thiscall Simulator::ClockReg<Simulator::WRegX>::tick(ClockReg<Simulator::WRegX> *this)

{
  int64_t iVar1;
  int64_t iVar2;
  uint32_t uVar3;
  InstSet IVar4;
  undefined4 uVar5;
  
  if (this->bubble == true) {
    (this->out).opcode = 0;
    (this->out).inst = UNKNOWN;
    this->stall = false;
    this->bubble = false;
    return;
  }
  if (this->stall == true) {
    this->stall = false;
    return;
  }
  uVar3 = (this->in).rd;
  iVar1 = (this->in).valE;
  iVar2 = (this->in).valM;
  IVar4 = (this->in).inst;
  uVar5 = *(undefined4 *)&(this->in).field_0x1c;
  (this->out).opcode = (this->in).opcode;
  (this->out).rd = uVar3;
  (this->out).valE = iVar1;
  (this->out).valM = iVar2;
  (this->out).inst = IVar4;
  *(undefined4 *)&(this->out).field_0x1c = uVar5;
  return;
}

Assistant:

void tick() {
            if (bubble) {
                out.opcode = RISCV_GRX::OP_BUBBLE;
                out.inst = RISCV_GRX::UNKNOWN;
                bubble = stall = false;
//                out.stall_count = 0;
            } else if (stall) {
                stall = false;
            } else {
                out = in;
            }
        }